

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O3

void CNetBan::ConBans(IResult *pResult,void *pUser)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  CBan<NETADDR> *pBan;
  CBan<CNetRange> *pBan_00;
  long in_FS_OFFSET;
  char aMsg [256];
  char aBuf [256];
  char acStack_238 [256];
  char local_138 [256];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pBan = *(CBan<NETADDR> **)((long)pUser + 0x22820);
  if (pBan == (CBan<NETADDR> *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    do {
      MakeBanInfo<NETADDR>((CNetBan *)pUser,pBan,local_138,0x100,1,(int *)0x0);
      uVar2 = uVar3 + 1;
      str_format(acStack_238,0x100,"#%i %s",(ulong)uVar3,local_138);
      (**(code **)(**(long **)((long)pUser + 8) + 200))
                (*(long **)((long)pUser + 8),0,"net_ban",acStack_238,0);
      pBan = pBan->m_pNext;
      uVar3 = uVar2;
    } while (pBan != (CBan<NETADDR> *)0x0);
  }
  pBan_00 = *(CBan<CNetRange> **)((long)pUser + 0x52838);
  if (pBan_00 != (CBan<CNetRange> *)0x0) {
    uVar3 = uVar2;
    do {
      MakeBanInfo<CNetRange>((CNetBan *)pUser,pBan_00,local_138,0x100,1,(int *)0x0);
      uVar2 = uVar3 + 1;
      str_format(acStack_238,0x100,"#%i %s",(ulong)uVar3,local_138);
      (**(code **)(**(long **)((long)pUser + 8) + 200))
                (*(long **)((long)pUser + 8),0,"net_ban",acStack_238,0);
      pBan_00 = pBan_00->m_pNext;
      uVar3 = uVar2;
    } while (pBan_00 != (CBan<CNetRange> *)0x0);
  }
  pcVar1 = "bans";
  if (uVar2 == 1) {
    pcVar1 = "ban";
  }
  str_format(acStack_238,0x100,"%d %s",(ulong)uVar2,pcVar1);
  (**(code **)(**(long **)((long)pUser + 8) + 200))
            (*(long **)((long)pUser + 8),0,"net_ban",acStack_238,0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CNetBan::ConBans(IConsole::IResult *pResult, void *pUser)
{
	CNetBan *pThis = static_cast<CNetBan *>(pUser);

	int Count = 0;
	char aBuf[256], aMsg[256];
	for(CBanAddr *pBan = pThis->m_BanAddrPool.First(); pBan; pBan = pBan->m_pNext)
	{
		pThis->MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_LIST);
		str_format(aMsg, sizeof(aMsg), "#%i %s", Count++, aBuf);
		pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aMsg);
	}
	for(CBanRange *pBan = pThis->m_BanRangePool.First(); pBan; pBan = pBan->m_pNext)
	{
		pThis->MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_LIST);
		str_format(aMsg, sizeof(aMsg), "#%i %s", Count++, aBuf);
		pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aMsg);
	}
	str_format(aMsg, sizeof(aMsg), "%d %s", Count, Count==1?"ban":"bans");
	pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aMsg);
}